

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

int __thiscall CTPNCall::gen_code_rand(CTPNCall *this,int discard,int for_condition)

{
  int iVar1;
  CTcPrsNode *pCVar2;
  size_t __n;
  uint in_EDX;
  uint in_ESI;
  CTPNCallBase *in_RDI;
  CTcCodeLabel *brklbl;
  vm_val_t val;
  char buf [5];
  int i;
  ulong caseofs;
  CTcNamedArgs named_args;
  CTPNArg *arg;
  int argc;
  CTPNArglist *args;
  CTcCodeLabel *in_stack_ffffffffffffff68;
  CTcCodeStream *in_stack_ffffffffffffff70;
  ulong uVar3;
  CTcCodeStream *in_stack_ffffffffffffff78;
  CTcDataStream *in_stack_ffffffffffffff80;
  vm_val_t local_68;
  undefined1 local_51 [5];
  int local_4c;
  ulong local_48;
  undefined4 local_40 [4];
  CTPNArgBase *local_30;
  int local_24;
  CTPNArglistBase *local_20;
  uint local_18;
  uint local_14;
  int local_4;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_20 = &CTPNCallBase::get_arg_list(in_RDI)->super_CTPNArglistBase;
  local_24 = CTPNArglistBase::get_argc(local_20);
  if (local_24 < 2) {
    local_4 = 0;
  }
  else {
    for (local_30 = &CTPNArglistBase::get_arg_list_head(local_20)->super_CTPNArgBase;
        local_30 != (CTPNArgBase *)0x0;
        local_30 = &CTPNArgBase::get_next_arg(local_30)->super_CTPNArgBase) {
      iVar1 = CTPNArgBase::is_varargs(local_30);
      if (iVar1 != 0) {
        return 0;
      }
    }
    local_40[0] = 0;
    CTPNConst::s_gen_code_int(0x281dc4);
    pCVar2 = CTPNCallBase::get_func(in_RDI);
    __n = 0;
    (*(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x15])(pCVar2,0,1,0,local_40);
    CTcGenTarg::write_op((CTcGenTarg *)named_args.args,named_args._7_1_);
    CTcDataStream::write2
              (&in_stack_ffffffffffffff70->super_CTcDataStream,
               (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    CTcGenTarg::note_pop((CTcGenTarg *)0x281e1e);
    local_48 = CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
    local_4c = local_24;
    while (local_4c = local_4c + -1, -1 < local_4c) {
      vm_val_t::set_int(&local_68,local_4c);
      vmb_put_dh((char *)in_stack_ffffffffffffff70,(vm_val_t *)in_stack_ffffffffffffff68);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)local_51,(void *)0x5,__n);
      CTcDataStream::write2
                (&in_stack_ffffffffffffff70->super_CTcDataStream,
                 (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    }
    CTcDataStream::write2
              (&in_stack_ffffffffffffff70->super_CTcDataStream,
               (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    CTcCodeStream::new_label_fwd(in_stack_ffffffffffffff70);
    local_30 = &CTPNArglistBase::get_arg_list_head(local_20)->super_CTPNArgBase;
    while (local_30 != (CTPNArgBase *)0x0) {
      in_stack_ffffffffffffff80 = (CTcDataStream *)(local_48 + 5);
      in_stack_ffffffffffffff78 = G_cs;
      CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
      CTcDataStream::write2_at
                (in_stack_ffffffffffffff80,(ulong)in_stack_ffffffffffffff78,
                 (uint)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      pCVar2 = CTPNArgBase::get_arg_expr(local_30);
      (**(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)
                (pCVar2,(ulong)local_14,(ulong)local_18);
      CTcGenTarg::write_op((CTcGenTarg *)named_args.args,named_args._7_1_);
      CTcCodeStream::write_ofs2(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
      if (local_14 == 0) {
        CTcGenTarg::note_pop((CTcGenTarg *)0x281f84);
      }
      local_30 = &CTPNArgBase::get_next_arg(local_30)->super_CTPNArgBase;
      local_48 = local_48 + 7;
    }
    uVar3 = local_48;
    CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
    CTcDataStream::write2_at
              (in_stack_ffffffffffffff80,(ulong)in_stack_ffffffffffffff78,(uint)(uVar3 >> 0x20));
    if (local_14 == 0) {
      CTcGenTarg::write_op((CTcGenTarg *)named_args.args,named_args._7_1_);
      CTcGenTarg::note_push((CTcGenTarg *)0x282011);
    }
    CTcPrsNode::def_label_pos((CTcCodeLabel *)in_stack_ffffffffffffff80);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CTPNCall::gen_code_rand(int discard, int for_condition)
{
    /* get our argument list, and the number of arguments */
    CTPNArglist *args = get_arg_list();
    int argc = args->get_argc();

    /* if we have zero or one argument, use the normal call */
    if (argc < 2)
        return FALSE;

    /* if we have variable arguments, use the normal call */
    CTPNArg *arg;
    for (arg = args->get_arg_list_head() ; arg != 0 ;
         arg = arg->get_next_arg())
    {
        if (arg->is_varargs())
            return FALSE;
    }

    /* 
     *   We have a fixed number of arguments greater than one, so this is the
     *   special form of the rand() call.  First, generate an ordinary call
     *   to rand() to select a number from 0 to argc-1.
     */
    CTcNamedArgs named_args;
    named_args.cnt = 0;
    CTPNConst::s_gen_code_int(argc);
    get_func()->gen_code_call(FALSE, 1, FALSE, &named_args);

    /* generate the SWITCH <case_cnt> */
    G_cg->write_op(OPC_SWITCH);
    G_cs->write2(argc);
    G_cg->note_pop();

    /* 
     *   Build the case table.  The rand() call gave us an integer from 0 to
     *   argc-1 inclusive, so our case labels are simply the argument index
     *   values, starting at zero.  Note that the argument list is stored
     *   right to left, so the index values of the list elements run from
     *   argc-1 down to 0.  Since we're making a random selection anyway the
     *   order shouldn't really matter; however, for the sake of regression
     *   tests for pre-3.1 games, we want to use the same index ordering that
     *   rand() did in the old version, where rand() itself chose one of its
     *   pre-evaluated arguments.  When running in regression mode with a
     *   fixed random number stream, using the same index ordering will
     *   ensure that we get the same results when running existing tests.  
     */
    ulong caseofs = G_cs->get_ofs();
    int i;
    for (i = argc - 1 ; i >= 0 ; --i)
    {
        /* write the case label as the 0-based argument index */
        char buf[VMB_DATAHOLDER];
        vm_val_t val;
        val.set_int(i);
        vmb_put_dh(buf, &val);
        G_cs->write(buf, VMB_DATAHOLDER);

        /* write a placeholder for the jump offset */
        G_cs->write2(0);
    }

    /* write a placeholder for the default case */
    G_cs->write2(0);

    /* create a forward label for the 'break' to the end of the switch */
    CTcCodeLabel *brklbl = G_cs->new_label_fwd();

    /* generate the argument expressions */
    for (arg = args->get_arg_list_head() ; arg != 0 ;
         arg = arg->get_next_arg(), caseofs += VMB_DATAHOLDER + 2)
    {
        /* set the jump to this case in the case table */
        G_cs->write2_at(caseofs + VMB_DATAHOLDER,
                        G_cs->get_ofs() - (caseofs + VMB_DATAHOLDER));

        /* generate the argument expression */
        arg->get_arg_expr()->gen_code(discard, for_condition);

        /* generate a jump to the end of the table */
        G_cg->write_op(OPC_JMP);
        G_cs->write_ofs2(brklbl, 0);

        /* we generate the branches in parallel, so only one push counts */
        if (!discard)
            G_cg->note_pop();
    }

    /* write the default case - just push nil if we need a value */
    G_cs->write2_at(caseofs, G_cs->get_ofs() - caseofs);
    if (!discard)
    {
        G_cg->write_op(OPC_PUSHNIL);
        G_cg->note_push();
    }

    /* this is the end of the switch - set the 'break' label here */
    def_label_pos(brklbl);

    /* tell the caller that we handled the code generation */
    return TRUE;
}